

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_match_data_init(parser_info *info,char **attr)

{
  coda_detection_rule *detection_rule;
  node_info *pnVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  coda_detection_rule_entry *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  coda_expression *pcVar9;
  char *pcVar10;
  coda_expression *op2;
  undefined8 uVar11;
  char **ppcVar12;
  char *pcVar13;
  char *pcVar14;
  char *__dest;
  char *__s;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  
  info->node->free_data = coda_detection_rule_entry_delete;
  pcVar8 = *attr;
  if (pcVar8 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    ppcVar12 = attr + 2;
    pcVar7 = (char *)0x0;
    pcVar13 = pcVar8;
    do {
      iVar4 = strcmp(pcVar13,"offset");
      if (iVar4 == 0) {
        pcVar7 = ppcVar12[-1];
        break;
      }
      pcVar13 = *ppcVar12;
      ppcVar12 = ppcVar12 + 2;
    } while (pcVar13 != (char *)0x0);
  }
  if (pcVar8 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    ppcVar12 = attr + 2;
    pcVar13 = (char *)0x0;
    do {
      iVar4 = strcmp(pcVar8,"path");
      if (iVar4 == 0) {
        pcVar13 = ppcVar12[-1];
        break;
      }
      pcVar8 = *ppcVar12;
      ppcVar12 = ppcVar12 + 2;
    } while (pcVar8 != (char *)0x0);
  }
  if (pcVar13 == (char *)0x0) {
    pcVar5 = coda_detection_rule_entry_new((char *)0x0);
    info->node->data = pcVar5;
    if (pcVar5 == (coda_detection_rule_entry *)0x0) {
      return -1;
    }
  }
  if (pcVar7 != (char *)0x0) {
    if (pcVar13 == (char *)0x0) {
      pcVar8 = strdup(pcVar7);
      if (pcVar8 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,0x9a0);
        return -1;
      }
      pcVar9 = coda_expression_new(expr_constant_integer,pcVar8,(coda_expression *)0x0,
                                   (coda_expression *)0x0,(coda_expression *)0x0,
                                   (coda_expression *)0x0);
      if (pcVar9 == (coda_expression *)0x0) {
        coda_set_error(-400,"invalid \'offset\' attribute value \'%s\'",pcVar7);
      }
      else {
        iVar4 = coda_detection_rule_entry_set_expression
                          ((coda_detection_rule_entry *)info->node->data,pcVar9);
        if (iVar4 == 0) goto LAB_0015be57;
        coda_expression_delete(pcVar9);
      }
    }
    else {
      coda_set_error(-400,"providing both \'path\' and \'offset\' attributes is not allowed");
    }
    return -1;
  }
  if (pcVar13 == (char *)0x0) goto LAB_0015be57;
  detection_rule = (coda_detection_rule *)info->node->parent->data;
  pcVar8 = strdup(pcVar13);
  if (pcVar8 == (char *)0x0) {
    uVar11 = 0x8ca;
LAB_0015bb22:
    coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                   ,uVar11);
  }
  else {
    sVar6 = strlen(pcVar13);
    pcVar7 = (char *)malloc(sVar6 + 6);
    if (pcVar7 == (char *)0x0) {
      uVar11 = 0x8d6;
      goto LAB_0015bb22;
    }
    *pcVar7 = '\0';
    pcVar13 = pcVar8;
    pcVar14 = pcVar7;
    if (*pcVar8 == '/') {
      *pcVar7 = '/';
      pcVar14 = pcVar7 + 1;
      pcVar13 = pcVar8 + 1;
    }
    bVar17 = false;
    bVar15 = *pcVar13 == '@';
    if (bVar15) {
      *pcVar14 = '@';
      pcVar14 = pcVar14 + 1;
      pcVar13 = pcVar13 + 1;
    }
    bVar16 = false;
    do {
      if (bVar17) {
        free(pcVar8);
        bVar17 = true;
        goto LAB_0015be2b;
      }
      __dest = pcVar14;
      if (bVar16) {
        cVar3 = '@';
        if (!bVar15) {
          cVar3 = '/';
        }
        *pcVar14 = cVar3;
        __dest = pcVar14 + 1;
      }
      pcVar14 = __dest;
      if (*pcVar13 == '{') {
        __s = pcVar13 + 1;
        for (pcVar13 = __s; *pcVar13 != '}'; pcVar13 = pcVar13 + 1) {
          if (*pcVar13 == '\0') {
            bVar2 = false;
            coda_set_error(-100,"xml detection rule for \'%s\' has invalid path value",
                           detection_rule->product_definition->name);
            free(pcVar7);
            free(pcVar8);
            bVar16 = bVar15;
            goto LAB_0015bd53;
          }
        }
        *pcVar13 = '\0';
        pcVar13 = pcVar13 + 1;
        pcVar10 = pcVar13;
      }
      else {
        __s = (char *)0x0;
        pcVar10 = pcVar13;
      }
      for (; ((cVar3 = *pcVar13, cVar3 != '\0' && (cVar3 != '/')) && (cVar3 != '@'));
          pcVar13 = pcVar13 + 1) {
      }
      bVar16 = cVar3 == '@';
      bVar17 = cVar3 == '\0';
      *pcVar13 = '\0';
      pcVar10 = coda_identifier_from_name(pcVar10,(hashtable *)0x0);
      if (pcVar10 == (char *)0x0) {
LAB_0015bd31:
        free(pcVar7);
        free(pcVar8);
        bVar2 = false;
      }
      else {
        strcpy(__dest,pcVar10);
        sVar6 = strlen(pcVar10);
        pcVar14 = __dest + sVar6;
        free(pcVar10);
        if (__s != (char *)0x0) {
          pcVar9 = coda_expression_new(expr_goto_here,(char *)0x0,(coda_expression *)0x0,
                                       (coda_expression *)0x0,(coda_expression *)0x0,
                                       (coda_expression *)0x0);
          if ((pcVar9 != (coda_expression *)0x0) &&
             (pcVar9 = coda_expression_new(expr_string,(char *)0x0,pcVar9,(coda_expression *)0x0,
                                           (coda_expression *)0x0,(coda_expression *)0x0),
             pcVar9 != (coda_expression *)0x0)) {
            pcVar10 = strdup(__s);
            if (pcVar10 == (char *)0x0) {
              coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                             "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                            );
              coda_expression_delete(pcVar9);
              goto LAB_0015bdec;
            }
            op2 = coda_expression_new(expr_constant_string,pcVar10,(coda_expression *)0x0,
                                      (coda_expression *)0x0,(coda_expression *)0x0,
                                      (coda_expression *)0x0);
            if (op2 != (coda_expression *)0x0) {
              pcVar9 = coda_expression_new(expr_equal,(char *)0x0,pcVar9,op2,(coda_expression *)0x0,
                                           (coda_expression *)0x0);
              if (pcVar9 == (coda_expression *)0x0) goto LAB_0015bd31;
              builtin_strncpy(__dest + sVar6,"@xmlns",7);
              pcVar5 = coda_detection_rule_entry_new(pcVar7);
              *pcVar14 = '\0';
              if (pcVar5 != (coda_detection_rule_entry *)0x0) {
                iVar4 = coda_detection_rule_entry_set_expression(pcVar5,pcVar9);
                if (iVar4 == 0) {
                  iVar4 = coda_detection_rule_add_entry(detection_rule,pcVar5);
                  if (iVar4 == 0) goto LAB_0015bdb5;
                  coda_detection_rule_entry_delete(pcVar5);
                  goto LAB_0015bd31;
                }
                coda_detection_rule_entry_delete(pcVar5);
              }
            }
            coda_expression_delete(pcVar9);
          }
          goto LAB_0015bd31;
        }
LAB_0015bdb5:
        bVar2 = true;
        if (cVar3 != '\0') {
          if (bVar15) {
            coda_set_error(-100,
                           "xml detection rule for \'%s\' has invalid path (attribute should be last item in path)"
                           ,detection_rule->product_definition->name);
LAB_0015bdec:
            bVar2 = false;
            free(pcVar7);
            free(pcVar8);
          }
          else {
            pcVar13 = pcVar13 + 1;
          }
        }
      }
LAB_0015bd53:
      bVar15 = bVar16;
      bVar16 = true;
    } while (bVar2);
  }
  pcVar7 = (char *)0x0;
  bVar17 = false;
LAB_0015be2b:
  if (!bVar17) {
    return -1;
  }
  pcVar5 = coda_detection_rule_entry_new(pcVar7);
  pnVar1 = info->node;
  pnVar1->data = pcVar5;
  free(pcVar7);
  if (pnVar1->data == (void *)0x0) {
    return -1;
  }
LAB_0015be57:
  pnVar1 = info->node;
  pnVar1->expect_char_data = 1;
  pnVar1->finalise_element = cd_match_data_finalise;
  return 0;
}

Assistant:

static int cd_match_data_init(parser_info *info, const char **attr)
{
    const char *offset_string;
    const char *path;
    coda_expression *expr;
    char *string_value;

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;

    offset_string = get_attribute_value(attr, "offset");
    path = get_attribute_value(attr, "path");

    if (path == NULL)
    {
        info->node->data = coda_detection_rule_entry_new(NULL);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    if (offset_string != NULL)
    {
        if (path != NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "providing both 'path' and 'offset' attributes is not allowed");
            return -1;
        }
        string_value = strdup(offset_string);
        if (string_value == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
        expr = coda_expression_new(expr_constant_integer, string_value, NULL, NULL, NULL, NULL);
        if (expr == NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'offset' attribute value '%s'", offset_string);
            return -1;
        }
        if (coda_detection_rule_entry_set_expression((coda_detection_rule_entry *)info->node->data, expr) != 0)
        {
            coda_expression_delete(expr);
            return -1;
        }
    }
    else if (path != NULL)
    {
        if (add_detection_rule_entry_for_path((coda_detection_rule *)info->node->parent->data, path, &string_value) !=
            0)
        {
            return -1;
        }
        info->node->data = coda_detection_rule_entry_new(string_value);
        free(string_value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_data_finalise;

    return 0;
}